

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O0

MPP_RET hal_h265e_v580_gen_regs(void *hal,HalEncTask *task)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  EncRcTask *pEVar5;
  H265eSyntax_new *syn_00;
  uint *puVar6;
  H265eV580RegSet *regs_00;
  VepuFmtCfg *fmt_00;
  MppEncCfgSet *enc_cfg;
  MPP_RET MVar7;
  EncFrmStatus *pEVar8;
  hevc_vepu580_base *regs_01;
  uint uVar9;
  double dVar10;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  RK_U32 i_nal_type;
  MppEncCfgSet *cfg;
  hevc_vepu580_rc_klut *reg_klut;
  hevc_vepu580_base *reg_base;
  hevc_vepu580_control_cfg *reg_ctl;
  VepuFmtCfg *fmt;
  RK_S32 pic_h64;
  RK_S32 pic_wd64;
  RK_U32 pic_height_align8;
  RK_U32 pic_width_align8;
  H265eV580RegSet *regs;
  Vepu580H265eFrmCfg *frm_cfg;
  H265eSyntax_new *syn;
  EncFrmStatus *frm;
  EncRcTask *rc_task;
  HalEncTask *enc_task;
  H265eV580HalContext *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  pEVar5 = task->rc_task;
  pEVar8 = &pEVar5->frm;
  syn_00 = *(H265eSyntax_new **)((long)hal + 0xd0);
  puVar6 = *(uint **)((long)hal + 0x80);
  regs_00 = *(H265eV580RegSet **)(puVar6 + 6);
  fmt_00 = *(VepuFmtCfg **)((long)hal + 0x110);
  regs_01 = &regs_00->reg_base;
  enc_cfg = *(MppEncCfgSet **)((long)hal + 200);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xa85);
  }
  uVar1 = (syn_00->pp).pic_width;
  uVar2 = (syn_00->pp).pic_height;
  uVar3 = (syn_00->pp).pic_width;
  uVar4 = (syn_00->pp).pic_height;
  if ((hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","frame %d | type %d | start gen regs","hal_h265e_v580_gen_regs",
               (ulong)*puVar6,(ulong)*(uint *)((long)hal + 0xb0));
  }
  memset(regs_00,0,0x1d08);
  if (1 < *(int *)((long)hal + 0x94)) {
    setup_vepu580_dual_core((H265eV580HalContext *)hal);
  }
  (regs_00->reg_ctl).reg0004_enc_strt =
       (anon_struct_4_3_aabe7823_for_reg0004_enc_strt)
       ((uint)(regs_00->reg_ctl).reg0004_enc_strt & 0xffffff00);
  (regs_00->reg_ctl).reg0004_enc_strt =
       (anon_struct_4_3_aabe7823_for_reg0004_enc_strt)
       ((uint)(regs_00->reg_ctl).reg0004_enc_strt & 0xfffffcff |
       (*(uint *)((long)hal + 0x100) & 3) << 8);
  (regs_00->reg_ctl).reg0005_enc_clr =
       (anon_struct_4_3_e8f47264_for_reg0005_enc_clr)
       ((uint)(regs_00->reg_ctl).reg0005_enc_clr & 0xfffffffe);
  (regs_00->reg_ctl).reg0005_enc_clr =
       (anon_struct_4_3_e8f47264_for_reg0005_enc_clr)
       ((uint)(regs_00->reg_ctl).reg0005_enc_clr & 0xfffffffd);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffffe | 1);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffffd | 2);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffffb | 4);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffff7);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffffef | 0x10);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffffdf | 0x20);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffffbf | 0x40);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffff7f | 0x80);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffeff | 0x100);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_11_f23807f4_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffdff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffffffe);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffffffd);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffffffb);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffffff7);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xffffff0f);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffff0ff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xffff8fff | 0x7000);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfff87fff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xff87ffff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xf87fffff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xf7ffffff | 0x8000000);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_13_b4167074_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xefffffff);
  (regs_00->reg_ctl).reg0013_dtrns_cfg =
       (anon_struct_4_5_ae5845b9_for_reg0013_dtrns_cfg)
       ((uint)(regs_00->reg_ctl).reg0013_dtrns_cfg & 0xffffff7f |
       (uint)(*(int *)((long)hal + 0xb0) == 0) << 7);
  (regs_00->reg_ctl).reg0013_dtrns_cfg =
       (anon_struct_4_5_ae5845b9_for_reg0013_dtrns_cfg)
       ((uint)(regs_00->reg_ctl).reg0013_dtrns_cfg & 0xff00ffff);
  (regs_00->reg_ctl).reg0014_enc_wdg =
       (anon_struct_4_2_39a7de62_for_reg0014_enc_wdg)
       ((uint)(regs_00->reg_ctl).reg0014_enc_wdg & 0xff000000 | 0x1fffff);
  (regs_00->reg_ctl).reg0014_enc_wdg =
       (anon_struct_4_2_39a7de62_for_reg0014_enc_wdg)
       ((uint)(regs_00->reg_ctl).reg0014_enc_wdg & 0xffffff);
  (regs_00->reg_ctl).reg0021_func_en =
       (anon_struct_4_5_8979cc6e_for_reg0021_func_en)
       ((uint)(regs_00->reg_ctl).reg0021_func_en & 0xfffffffe | 1);
  (regs_00->reg_ctl).reg0021_func_en =
       (anon_struct_4_5_8979cc6e_for_reg0021_func_en)
       ((uint)(regs_00->reg_ctl).reg0021_func_en & 0xfffffffd | 2);
  (regs_00->reg_ctl).reg0021_func_en =
       (anon_struct_4_5_8979cc6e_for_reg0021_func_en)
       ((uint)(regs_00->reg_ctl).reg0021_func_en & 0xfffffffb | 4);
  (regs_00->reg_base).reg0196_enc_rsl =
       (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
       ((uint)(regs_00->reg_base).reg0196_enc_rsl & 0xfffff800 | (uVar1 + 7 >> 3) - 1 & 0x7ff);
  if (((syn_00->pp).pic_width & 7) == 0) {
    local_90 = 0;
  }
  else {
    local_90 = 8 - ((syn_00->pp).pic_width & 7);
  }
  (regs_00->reg_base).reg0197_src_fill =
       (anon_struct_4_4_c09dc813_for_reg0197_src_fill)
       ((uint)(regs_00->reg_base).reg0197_src_fill & 0xffffffc0 | local_90 & 0x3f);
  (regs_00->reg_base).reg0196_enc_rsl =
       (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
       ((uint)(regs_00->reg_base).reg0196_enc_rsl & 0xf800ffff |
       ((uVar2 + 7 >> 3) - 1 & 0x7ff) << 0x10);
  if (((syn_00->pp).pic_height & 7) == 0) {
    local_94 = 0;
  }
  else {
    local_94 = 8 - ((syn_00->pp).pic_height & 7);
  }
  (regs_00->reg_base).reg0197_src_fill =
       (anon_struct_4_4_c09dc813_for_reg0197_src_fill)
       ((uint)(regs_00->reg_base).reg0197_src_fill & 0xffc0ffff | (local_94 & 0x3f) << 0x10);
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
       ((uint)(regs_00->reg_base).reg0192_enc_pic | 1);
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
       (((uint)(regs_00->reg_base).reg0192_enc_pic & 0xfffffffb) +
       (uint)((syn_00->sp).non_reference_flag == 0) * 4);
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
       ((uint)(regs_00->reg_base).reg0192_enc_pic | 0x10);
  dVar10 = log2((double)((uVar3 + 0x3f) / 0x40) * (double)((uVar4 + 0x3f) / 0x40));
  dVar10 = ceil(dVar10);
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
       ((uint)(regs_00->reg_base).reg0192_enc_pic & 0xff07ffff | ((uint)(long)dVar10 & 0x1f) << 0x13
       );
  (regs_00->reg_base).reg0203_src_proc =
       (anon_struct_4_6_12227d3a_for_reg0203_src_proc)
       ((uint)(regs_00->reg_base).reg0203_src_proc & 0xfbffffff);
  (regs_00->reg_base).reg0203_src_proc =
       (anon_struct_4_6_12227d3a_for_reg0203_src_proc)
       ((uint)(regs_00->reg_base).reg0203_src_proc & 0xe7ffffff);
  (regs_00->reg_base).reg0203_src_proc =
       (anon_struct_4_6_12227d3a_for_reg0203_src_proc)
       ((uint)(regs_00->reg_base).reg0203_src_proc & 0xdfffffff | 0x20000000);
  (regs_00->reg_base).reg0203_src_proc =
       (anon_struct_4_6_12227d3a_for_reg0203_src_proc)
       ((uint)(regs_00->reg_base).reg0203_src_proc & 0xbfffffff |
       (uint)(((syn_00->pp).mpp_format & 0xf00000) != 0) << 0x1e);
  uVar9 = 3;
  if (*(int *)((long)hal + 0xb0) == 2) {
    uVar9 = 0;
  }
  (regs_00->reg_rc_klut).klut_ofst =
       (anon_struct_4_2_83ae6191_for_klut_ofst)
       ((uint)(regs_00->reg_rc_klut).klut_ofst & 0xfffffff8 | uVar9);
  memcpy(&(regs_00->reg_rc_klut).klut_wgt0,klut_weight,0x60);
  vepu580_h265_set_me_regs((H265eV580HalContext *)hal,syn_00,regs_01);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffb | 4);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xffff8007 | 0x36d8);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xff87ffff | 0x780000);
  if ((syn_00->pp).num_long_term_ref_pics_sps == '\0') {
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffe);
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffd);
  }
  else {
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffe);
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffd | 2);
  }
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xff7fffff | 0x800000);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_10_61996a8e_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfcffffff |
       ((syn_00->pp).field_21.CodingParamToolFlags & 1) << 0x18);
  if (*(int *)((long)hal + 0xb0) == 2) {
    local_8c = 0x13;
  }
  else {
    local_8c = 1;
  }
  if ((syn_00->sp).temporal_id == 0) {
    local_98 = local_8c;
  }
  else {
    local_98 = 3;
  }
  (regs_00->reg_base).reg0236_synt_nal =
       (anon_struct_4_2_8616aad8_for_reg0236_synt_nal)
       ((uint)(regs_00->reg_base).reg0236_synt_nal & 0xffffffc0 | local_98);
  vepu580_h265_set_hw_address((H265eV580HalContext *)hal,task);
  vepu580_h265_set_pp_regs(regs_00,fmt_00,(MppEncPrepCfg *)(*(long *)((long)hal + 200) + 8),task);
  vepu580_h265_set_rc_regs((H265eV580HalContext *)hal,regs_00,task);
  vepu580_h265_set_slice_regs(syn_00,regs_01);
  vepu580_h265_set_ref_regs(syn_00,regs_01);
  vepu580_set_osd((Vepu541OsdCfg *)(*(long *)((long)hal + 0x80) + 0x1c8));
  vepu580_h265_set_roi_regs((H265eV580HalContext *)hal,regs_01);
  if ((pEVar8->val >> 0x26 & 1) != 0) {
    setup_intra_refresh((H265eV580HalContext *)hal,
                        (RK_U32)((long)(pEVar8->val >> 0x30) %
                                (long)*(int *)(*(long *)((long)hal + 200) + 0xc4)));
  }
  if (((((enc_cfg->tune).deblur_en != 0) && ((pEVar5->info).complex_scene == 0)) &&
      ((enc_cfg->rc).rc_mode == MPP_ENC_RC_MODE_SMTRC)) &&
     (((task->md_info != (MppBuffer)0x0 && ((enc_cfg->tune).scene_mode == MPP_ENC_SCENE_MODE_IPC))
      && (MVar7 = vepu580_setup_qpmap_buf((H265eV580HalContext *)hal), MVar7 != MPP_OK)))) {
    _mpp_log_l(2,"hal_h265e_v580","qpmap malloc buffer failed!\n",(char *)0x0);
  }
  vepu580_h265_global_cfg_set((H265eV580HalContext *)hal,regs_00);
  vepu580_h265e_tune_reg_patch(*(void **)((long)hal + 0x150));
  vepu580_setup_split(regs_00,enc_cfg,
                      (syn_00->pp).field_22.CodingSettingPicturePropertyFlags >> 7 & 1);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xb07);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v580_gen_regs(void *hal, HalEncTask *task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    HalEncTask *enc_task = task;
    EncRcTask *rc_task = enc_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    H265eSyntax_new *syn = ctx->syn;
    Vepu580H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV580RegSet *regs = frm_cfg->regs_set[0];
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 pic_wd64, pic_h64;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    hevc_vepu580_control_cfg *reg_ctl = &regs->reg_ctl;
    hevc_vepu580_base        *reg_base = &regs->reg_base;
    hevc_vepu580_rc_klut *reg_klut = &regs->reg_rc_klut;
    MppEncCfgSet *cfg = ctx->cfg;

    hal_h265e_enter();
    pic_width_align8 = (syn->pp.pic_width + 7) & (~7);
    pic_height_align8 = (syn->pp.pic_height + 7) & (~7);
    pic_wd64 = (syn->pp.pic_width + 63) / 64;
    pic_h64 = (syn->pp.pic_height + 63) / 64;

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs",
                         frm_cfg->frame_count, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV580RegSet));

    if (ctx->task_cnt > 1)
        setup_vepu580_dual_core(ctx);

    reg_ctl->reg0004_enc_strt.lkt_num      = 0;
    reg_ctl->reg0004_enc_strt.vepu_cmd     = ctx->enc_mode;
    reg_ctl->reg0005_enc_clr.safe_clr      = 0x0;
    reg_ctl->reg0005_enc_clr.force_clr     = 0x0;

    reg_ctl->reg0008_int_en.enc_done_en         = 1;
    reg_ctl->reg0008_int_en.lkt_node_done_en    = 1;
    reg_ctl->reg0008_int_en.sclr_done_en        = 1;
    reg_ctl->reg0008_int_en.slc_done_en         = 0;
    reg_ctl->reg0008_int_en.bsf_oflw_en         = 1;
    reg_ctl->reg0008_int_en.brsp_otsd_en        = 1;
    reg_ctl->reg0008_int_en.wbus_err_en         = 1;
    reg_ctl->reg0008_int_en.rbus_err_en         = 1;
    reg_ctl->reg0008_int_en.wdg_en              = 1;
    reg_ctl->reg0008_int_en.lkt_err_int_en      = 0;

    reg_ctl->reg0012_dtrns_map.lpfw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.cmvw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.dspw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.rfpw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.src_bus_edin     = 0x0;
    reg_ctl->reg0012_dtrns_map.meiw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.bsw_bus_edin     = 0x7;
    reg_ctl->reg0012_dtrns_map.lktr_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.roir_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.lktw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.afbc_bsize       = 0x1;
    reg_ctl->reg0012_dtrns_map.ebufw_bus_ordr   = 0x0;

    reg_ctl->reg0013_dtrns_cfg.dspr_otsd        = (ctx->frame_type == INTER_P_FRAME);
    reg_ctl->reg0013_dtrns_cfg.axi_brsp_cke     = 0x0;
    reg_ctl->reg0014_enc_wdg.vs_load_thd        = 0x1fffff;
    reg_ctl->reg0014_enc_wdg.rfp_load_thd       = 0;

    reg_ctl->reg0021_func_en.cke                = 1;
    reg_ctl->reg0021_func_en.resetn_hw_en       = 1;
    reg_ctl->reg0021_func_en.enc_done_tmvp_en   = 1;

    reg_base->reg0196_enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_wfill    = (syn->pp.pic_width & 0x7)
                                              ? (8 - (syn->pp.pic_width & 0x7)) : 0;
    reg_base->reg0196_enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_hfill    = (syn->pp.pic_height & 0x7)
                                              ? (8 - (syn->pp.pic_height & 0x7)) : 0;

    reg_base->reg0192_enc_pic.enc_stnd      = 1; //H265
    reg_base->reg0192_enc_pic.cur_frm_ref   = !syn->sp.non_reference_flag; //current frame will be refered
    reg_base->reg0192_enc_pic.bs_scp        = 1;
    reg_base->reg0192_enc_pic.log2_ctu_num  = ceil(log2((double)pic_wd64 * pic_h64));

    reg_base->reg0203_src_proc.src_mirr = 0;
    reg_base->reg0203_src_proc.src_rot  = 0;
    reg_base->reg0203_src_proc.txa_en   = 1;
    reg_base->reg0203_src_proc.afbcd_en = (MPP_FRAME_FMT_IS_FBC(syn->pp.mpp_format)) ? 1 : 0;

    reg_klut->klut_ofst.chrm_klut_ofst = (ctx->frame_type == INTRA_FRAME) ? 0 : 3;
    memcpy(&reg_klut->klut_wgt0, &klut_weight[0], sizeof(klut_weight));

    vepu580_h265_set_me_regs(ctx, syn, reg_base);

    reg_base->reg0232_rdo_cfg.chrm_spcl   = 1;
    reg_base->reg0232_rdo_cfg.cu_inter_e    = 0x06db;
    reg_base->reg0232_rdo_cfg.cu_intra_e    = 0xf;

    if (syn->pp.num_long_term_ref_pics_sps) {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 1;
    } else {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 0;
    }

    reg_base->reg0232_rdo_cfg.ccwa_e = 1;
    reg_base->reg0232_rdo_cfg.scl_lst_sel = syn->pp.scaling_list_enabled_flag;
    {
        RK_U32 i_nal_type = 0;

        /* TODO: extend syn->frame_coding_type definition */
        if (ctx->frame_type == INTRA_FRAME) {
            /* reset ref pictures */
            i_nal_type    = NAL_IDR_W_RADL;
        } else if (ctx->frame_type == INTER_P_FRAME ) {
            i_nal_type    = NAL_TRAIL_R;
        } else {
            i_nal_type    = NAL_TRAIL_R;
        }

        reg_base->reg0236_synt_nal.nal_unit_type    = syn->sp.temporal_id ? NAL_TSA_R : i_nal_type;
    }

    vepu580_h265_set_hw_address(ctx, task);
    vepu580_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep, task);
    vepu580_h265_set_rc_regs(ctx, regs, task);
    vepu580_h265_set_slice_regs(syn, reg_base);
    vepu580_h265_set_ref_regs(syn, reg_base);

    vepu580_set_osd(&ctx->frm->osd_cfg);
    /* ROI configure */
    vepu580_h265_set_roi_regs(ctx, reg_base);
    if (frm->is_i_refresh)
        setup_intra_refresh(ctx, frm->seq_idx % ctx->cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC && task->md_info &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != vepu580_setup_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    /*paramet cfg*/
    vepu580_h265_global_cfg_set(ctx, regs);

    vepu580_h265e_tune_reg_patch(ctx->tune);

    vepu580_setup_split(regs, cfg, syn->pp.tiles_enabled_flag);

    hal_h265e_leave();
    return MPP_OK;
}